

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

float ma_fader_get_current_volume(ma_fader *pFader)

{
  ulong uVar1;
  
  if (pFader == (ma_fader *)0x0) {
    return 0.0;
  }
  uVar1 = pFader->cursorInFrames;
  if (uVar1 != 0) {
    if (uVar1 < pFader->lengthInFrames) {
      return (pFader->volumeEnd - pFader->volumeBeg) *
             ((float)(uVar1 & 0xffffffff) / (float)(pFader->lengthInFrames & 0xffffffff)) +
             pFader->volumeBeg;
    }
    return pFader->volumeEnd;
  }
  return pFader->volumeBeg;
}

Assistant:

MA_API float ma_fader_get_current_volume(ma_fader* pFader)
{
    if (pFader == NULL) {
        return 0.0f;
    }

    /* The current volume depends on the position of the cursor. */
    if (pFader->cursorInFrames == 0) {
        return pFader->volumeBeg;
    } else if (pFader->cursorInFrames >= pFader->lengthInFrames) {
        return pFader->volumeEnd;
    } else {
        /* The cursor is somewhere inside the fading period. We can figure this out with a simple linear interpoluation between volumeBeg and volumeEnd based on our cursor position. */
        return ma_mix_f32_fast(pFader->volumeBeg, pFader->volumeEnd, (ma_uint32)pFader->cursorInFrames / (float)((ma_uint32)pFader->lengthInFrames));    /* Safe cast to uint32 because we clamp it in ma_fader_process_pcm_frames(). */
    }
}